

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_CharMap find_variant_selector_charmap(FT_Face face)

{
  FT_CharMap *ppFVar1;
  FT_Long FVar2;
  FT_CharMap *local_30;
  FT_CharMap *cur;
  FT_CharMap *end;
  FT_CharMap *first;
  FT_Face face_local;
  
  local_30 = face->charmaps;
  if (local_30 != (FT_CharMap *)0x0) {
    ppFVar1 = local_30 + face->num_charmaps;
    for (; local_30 < ppFVar1; local_30 = local_30 + 1) {
      if ((((*local_30)->platform_id == 0) && ((*local_30)->encoding_id == 5)) &&
         (FVar2 = FT_Get_CMap_Format(*local_30), FVar2 == 0xe)) {
        return *local_30;
      }
    }
  }
  return (FT_CharMap)0x0;
}

Assistant:

static FT_CharMap
  find_variant_selector_charmap( FT_Face  face )
  {
    FT_CharMap*  first;
    FT_CharMap*  end;
    FT_CharMap*  cur;


    /* caller should have already checked that `face' is valid */
    FT_ASSERT( face );

    first = face->charmaps;

    if ( !first )
      return NULL;

    end = first + face->num_charmaps;  /* points after the last one */

    for ( cur = first; cur < end; cur++ )
    {
      if ( cur[0]->platform_id == TT_PLATFORM_APPLE_UNICODE    &&
           cur[0]->encoding_id == TT_APPLE_ID_VARIANT_SELECTOR &&
           FT_Get_CMap_Format( cur[0] ) == 14                  )
        return cur[0];
    }

    return NULL;
  }